

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::move_up(Fl_Text_Display *this)

{
  int iVar1;
  int local_2c;
  int lineEnd;
  int visLineNum;
  int newPos;
  int prevLineStartPos;
  int xPos;
  int lineStartPos;
  Fl_Text_Display *this_local;
  
  _xPos = this;
  iVar1 = position_to_line(this,this->mCursorPos,&local_2c);
  if (iVar1 == 0) {
    prevLineStartPos = line_start(this,this->mCursorPos);
    local_2c = -1;
  }
  else {
    prevLineStartPos = this->mLineStarts[local_2c];
  }
  if (prevLineStartPos == 0) {
    this_local._4_4_ = 0;
  }
  else {
    if (this->mCursorPreferredXPos < 0) {
      newPos = handle_vline(this,3,prevLineStartPos,this->mCursorPos - prevLineStartPos,0,0,0,0,0,
                            0x7fffffff);
    }
    else {
      newPos = this->mCursorPreferredXPos;
    }
    if ((local_2c == -1) || (local_2c == 0)) {
      visLineNum = rewind_lines(this,prevLineStartPos,1);
    }
    else {
      visLineNum = this->mLineStarts[local_2c + -1];
    }
    iVar1 = line_end(this,visLineNum,true);
    lineEnd = handle_vline(this,2,visLineNum,iVar1 - visLineNum,0,0,0,0,0,newPos);
    insert_position(this,lineEnd);
    this->mCursorPreferredXPos = newPos;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::move_up() {
  int lineStartPos, xPos, prevLineStartPos, newPos, visLineNum;

  /* Find the position of the start of the line.  Use the line starts array
   if possible */
  if ( position_to_line( mCursorPos, &visLineNum ) )
    lineStartPos = mLineStarts[ visLineNum ];
  else {
    lineStartPos = line_start( mCursorPos );
    visLineNum = -1;
  }
  if ( lineStartPos == 0 )
    return 0;

  /* Decide what column to move to, if there's a preferred column use that */
  if (mCursorPreferredXPos >= 0)
    xPos = mCursorPreferredXPos;
  else
    xPos = handle_vline(GET_WIDTH, lineStartPos, mCursorPos-lineStartPos,
                        0, 0, 0, 0, 0, INT_MAX);

  /* count forward from the start of the previous line to reach the column */
  if ( visLineNum != -1 && visLineNum != 0 )
    prevLineStartPos = mLineStarts[ visLineNum - 1 ];
  else
    prevLineStartPos = rewind_lines( lineStartPos, 1 );

  int lineEnd = line_end(prevLineStartPos, true);
  newPos = handle_vline(FIND_INDEX_FROM_ZERO, prevLineStartPos, lineEnd-prevLineStartPos,
                        0, 0, 0, 0, 0, xPos);

  /* move the cursor */
  insert_position( newPos );

  /* if a preferred column wasn't aleady established, establish it */
  mCursorPreferredXPos = xPos;
  return 1;
}